

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

bool __thiscall
HighsSymmetryDetection::compareCurrentGraph
          (HighsSymmetryDetection *this,
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *otherGraph,HighsInt *wrongCell)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  ValueType *pVVar4;
  value_type *in_RDX;
  KeyType *in_RSI;
  long in_RDI;
  HighsInt j_1;
  HighsInt j;
  HighsInt colCell;
  HighsInt i;
  reference in_stack_ffffffffffffff78;
  KeyType *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  KeyType *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  int local_3c;
  int local_2c;
  int local_24;
  
  local_24 = 0;
  do {
    if (*(int *)(in_RDI + 0x2a4) <= local_24) {
      return true;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(long)local_24);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_24);
    local_2c = *pvVar2;
    while (iVar5 = local_2c,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_24),
          iVar5 != *pvVar2) {
      in_stack_ffffffffffffffa0 = in_RSI;
      pvVar3 = std::
               vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                             *)(in_RDI + 0x38),(long)local_2c);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(long)pvVar3->first);
      std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::
      operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                  *)(in_RDI + 0x38),(long)local_2c);
      std::make_tuple<int&,int&,unsigned_int&>
                ((int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (int *)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
      pVVar4 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::find
                         ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                          CONCAT44(iVar5,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
      if (pVVar4 == (ValueType *)0x0) {
        *in_RDX = vVar1;
        return false;
      }
      local_2c = local_2c + 1;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_24);
    local_3c = *pvVar2;
    while (in_stack_ffffffffffffff8c = local_3c,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)(local_24 + 1)
                             ), in_stack_ffffffffffffff8c != *pvVar2) {
      in_stack_ffffffffffffff80 = in_RSI;
      in_stack_ffffffffffffff78 =
           std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
           ::operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                         *)(in_RDI + 0x38),(long)local_3c);
      std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::
      operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                  *)(in_RDI + 0x38),(long)local_3c);
      std::make_tuple<int&,int&,unsigned_int&>
                ((int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (int *)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
      pVVar4 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::find
                         ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                          CONCAT44(iVar5,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
      if (pVVar4 == (ValueType *)0x0) {
        *in_RDX = vVar1;
        return false;
      }
      local_3c = local_3c + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool HighsSymmetryDetection::compareCurrentGraph(
    const HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>& otherGraph,
    HighsInt& wrongCell) {
  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];

    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      if (!otherGraph.find(std::make_tuple(vertexToCell[Gedge[j].first],
                                           colCell, Gedge[j].second))) {
        // return which cell does not match in its neighbourhood as this should
        // have been detected with the hashing it can very rarely happen due to
        // a hash collision. In such a case we want to backtrack to the last
        // time where we targeted this particular cell. Otherwise we could spent
        // a long time searching for a matching leave value until every
        // combination is exhausted and for each leave in this subtree the graph
        // comparison will fail on this edge.
        wrongCell = colCell;
        return false;
      }
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      if (!otherGraph.find(
              std::make_tuple(Gedge[j].first, colCell, Gedge[j].second))) {
        wrongCell = colCell;
        return false;
      }
  }

  return true;
}